

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O3

void __thiscall
DBaseStatusBar::DrSmallNumberOuter(DBaseStatusBar *this,int val,int x,int y,bool center)

{
  int iVar1;
  int iVar2;
  DFrameBuffer *pDVar3;
  uint uVar4;
  FTexture *pFVar5;
  double local_38;
  
  pDVar3 = screen;
  uVar4 = 999;
  if (val < 999) {
    uVar4 = val;
  }
  if (val < 100) {
    if (val < 10) goto LAB_004cf323;
  }
  else {
    pFVar5 = FImageCollection::operator[](&this->Images,uVar4 / 100 + 0x17);
    DCanvas::DrawTexture((DCanvas *)pDVar3,pFVar5,(double)x,(double)y,0x400013a6,center,0);
    uVar4 = uVar4 % 100;
  }
  pDVar3 = screen;
  local_38 = (double)y;
  iVar2 = (int)uVar4 >> 0x1f;
  iVar1 = (int)uVar4 / 10 + iVar2;
  pFVar5 = FImageCollection::operator[](&this->Images,(iVar1 - iVar2) + 0x17);
  DCanvas::DrawTexture((DCanvas *)pDVar3,pFVar5,(double)(x + 4),local_38,0x400013a6,(ulong)center,0)
  ;
  uVar4 = uVar4 + (iVar1 - iVar2) * -10;
LAB_004cf323:
  pDVar3 = screen;
  local_38 = (double)y;
  pFVar5 = FImageCollection::operator[](&this->Images,uVar4 + 0x17);
  DCanvas::DrawTexture((DCanvas *)pDVar3,pFVar5,(double)(x + 8),local_38,0x400013a6,(ulong)center,0)
  ;
  return;
}

Assistant:

void DBaseStatusBar::DrSmallNumberOuter (int val, int x, int y, bool center) const
{
	int digit = 0;

	if (val > 999)
	{
		val = 999;
	}
	if (val > 99)
	{
		digit = val / 100;
		screen->DrawTexture (Images[imgSmNumbers + digit], x, y,
			DTA_HUDRules, center ? HUD_HorizCenter : HUD_Normal, TAG_DONE);
		val -= digit * 100;
	}
	if (val > 9 || digit)
	{
		digit = val / 10;
		screen->DrawTexture (Images[imgSmNumbers + digit], x+4, y,
			DTA_HUDRules, center ? HUD_HorizCenter : HUD_Normal, TAG_DONE);
		val -= digit * 10;
	}
	screen->DrawTexture (Images[imgSmNumbers + val], x+8, y,
		DTA_HUDRules, center ? HUD_HorizCenter : HUD_Normal, TAG_DONE);
}